

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowTabBar::mouseMoveEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  QTabBarPrivate *this_00;
  int *piVar1;
  QMovableTabWidget *pQVar2;
  QDockWidgetPrivate *this_01;
  QWidgetData *pQVar3;
  char cVar4;
  DockOptions DVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  DockWidgetFeatures DVar11;
  ulong uVar12;
  QObject *pQVar13;
  undefined8 uVar14;
  QLayout *pQVar15;
  long lVar16;
  QWidget *pQVar17;
  int iVar18;
  Representation RVar19;
  ulong uVar20;
  long lVar21;
  QWidget *this_02;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar25 [16];
  QPoint local_50;
  QPoint local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)(this + 8);
  if ((((*(long *)(this + 0x30) == 0) || (*(int *)(*(long *)(this + 0x30) + 4) == 0)) ||
      (*(long *)(this + 0x38) == 0)) &&
     (DVar5 = QMainWindow::dockOptions(*(QMainWindow **)(this + 0x28)),
     ((uint)DVar5.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
            super_QFlagsStorage<QMainWindow::DockOption>.i & 0x20) != 0)) {
    iVar6 = QApplication::startDragDistance();
    iVar7 = iVar6 * 3 + 3;
    lVar16 = *(long *)(this + 0x20);
    RVar19.m_i = iVar6 * -3 + -3;
    local_48.yp.m_i = RVar19.m_i;
    local_48.xp.m_i = RVar19.m_i;
    uStack_40 = CONCAT44((iVar7 + *(int *)(lVar16 + 0x20)) - *(int *)(lVar16 + 0x18),
                         (*(int *)(lVar16 + 0x1c) + iVar7) - *(int *)(lVar16 + 0x14));
    if ((*(uint *)&this_00->field_0x2d0 >> 9 & 1) != 0) {
      uVar8 = QEventPoint::position();
      auVar25._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar25._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar25 = minpd(_DAT_0066f5d0,auVar25);
      auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar25._8_8_);
      auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar25._0_8_);
      uVar9 = movmskpd(uVar8,auVar22);
      uVar20 = 0x8000000000000000;
      if ((uVar9 & 1) != 0) {
        uVar20 = (ulong)(uint)(int)auVar25._0_8_ << 0x20;
      }
      uVar12 = 0x80000000;
      if ((uVar9 & 2) != 0) {
        uVar12 = (ulong)(uint)(int)auVar25._8_8_;
      }
      local_50 = (QPoint)(uVar12 | uVar20);
      cVar4 = QRect::contains(&local_48,SUB81(&local_50,0));
      if (cVar4 == '\0') {
        iVar6 = this_00->pressedIndex;
        if ((-1 < (long)iVar6) && ((ulong)(long)iVar6 < (ulong)(this_00->tabList).d.size)) {
          pQVar13 = (QObject *)dockAt(this,iVar6);
          if (pQVar13 == (QObject *)0x0) {
            uVar14 = 0;
          }
          else {
            uVar14 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar13);
          }
          piVar1 = *(int **)(this + 0x30);
          *(undefined8 *)(this + 0x30) = uVar14;
          *(QObject **)(this + 0x38) = pQVar13;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              operator_delete(piVar1);
            }
          }
          if (((*(long *)(this + 0x30) != 0) && (*(int *)(*(long *)(this + 0x30) + 4) != 0)) &&
             (*(long *)(this + 0x38) != 0)) {
            QTabBarPrivate::moveTabFinished(this_00,this_00->pressedIndex);
            this_00->pressedIndex = -1;
            pQVar2 = this_00->movingTab;
            if (pQVar2 != (QMovableTabWidget *)0x0) {
              (**(code **)(*(long *)&pQVar2->super_QWidget + 0x68))(pQVar2,0);
            }
            (this_00->dragStartPosition).xp = 0;
            (this_00->dragStartPosition).yp = 0;
            this_01 = *(QDockWidgetPrivate **)(*(long *)(this + 0x38) + 8);
            pQVar15 = QWidget::layout(*(QWidget **)(this + 0x38));
            lVar16 = *(long *)&pQVar15[1].super_QLayoutItem.align;
            lVar21 = (long)(int)*(long *)(pQVar15 + 2) + (long)(int)lVar16;
            lVar16 = (*(long *)(pQVar15 + 2) >> 0x20) + (lVar16 >> 0x20);
            local_50 = (QPoint)((ulong)(lVar21 - (lVar21 >> 0x3f)) >> 1 & 0xffffffff |
                               (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
            QDockWidgetPrivate::initDrag(this_01,&local_50,true);
            QDockWidgetPrivate::startDrag(this_01,Widget);
            if (this_01->state != (DragState *)0x0) {
              this_01->state->ctrlDrag = (bool)((byte)((uint)*(undefined4 *)(e + 0x20) >> 0x1a) & 1)
              ;
            }
          }
        }
      }
    }
  }
  if ((((*(long *)(this + 0x30) != 0) && (*(int *)(*(long *)(this + 0x30) + 4) != 0)) &&
      (*(long *)(this + 0x38) != 0)) &&
     ((lVar16 = *(long *)(*(long *)(*(long *)(this + 0x38) + 8) + 600), lVar16 != 0 &&
      (*(char *)(lVar16 + 0x18) == '\x01')))) {
    uVar8 = QEventPoint::globalPosition();
    auVar23._0_8_ =
         (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa_00;
    auVar23._8_8_ =
         (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa_00;
    auVar25 = minpd(_DAT_0066f5d0,auVar23);
    auVar24._8_8_ = -(ulong)(-2147483648.0 < auVar25._8_8_);
    auVar24._0_8_ = -(ulong)(-2147483648.0 < auVar25._0_8_);
    uVar9 = movmskpd(uVar8,auVar24);
    iVar6 = (int)auVar25._8_8_;
    if ((uVar9 & 2) == 0) {
      iVar6 = -0x80000000;
    }
    iVar7 = (int)auVar25._0_8_;
    if ((uVar9 & 1) == 0) {
      iVar7 = -0x80000000;
    }
    if ((*(long *)(this + 0x30) == 0) || (*(int *)(*(long *)(this + 0x30) + 4) == 0)) {
      this_02 = (QWidget *)0x0;
    }
    else {
      this_02 = *(QWidget **)(this + 0x38);
    }
    pQVar17 = QDockWidget::titleBarWidget((QDockWidget *)this_02);
    if (pQVar17 == (QWidget *)0x0) {
      DVar11 = QDockWidget::features((QDockWidget *)this_02);
      if (((uint)DVar11.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                 super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 8) == 0) {
        iVar10 = (this_02->data->crect).x2.m_i - (this_02->data->crect).x1.m_i;
        iVar10 = (iVar10 - (iVar10 + 1 >> 0x1f)) + 1 >> 1;
      }
      else {
        iVar10 = QApplication::startDragDistance();
      }
      if (((uint)DVar11.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                 super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 8) == 0) {
        iVar18 = QApplication::startDragDistance();
      }
      else {
        iVar18 = (this_02->data->crect).y2.m_i - (this_02->data->crect).y1.m_i;
        iVar18 = (iVar18 - (iVar18 + 1 >> 0x1f)) + 1 >> 1;
      }
    }
    else {
      pQVar3 = pQVar17->data;
      iVar10 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) / 2;
      iVar18 = ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) / 2;
    }
    local_48.xp.m_i = iVar6 - iVar10;
    local_48.yp.m_i = iVar7 - iVar18;
    QWidget::move(this_02,&local_48);
  }
  QTabBar::mouseMoveEvent((QTabBar *)this,e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowTabBar::mouseMoveEvent(QMouseEvent *e)
{
    // The QTabBar handles the moving (reordering) of tabs.
    // When QTabBarPrivate::dragInProgress is true, and that the mouse is outside of a region
    // around the QTabBar, we will consider the user wants to drag that QDockWidget away from this
    // tab area.

    QTabBarPrivate *d = static_cast<QTabBarPrivate*>(d_ptr.data());
    if (!draggingDock && (mainWindow->dockOptions() & QMainWindow::GroupedDragging)) {
        int offset = QApplication::startDragDistance() + 1;
        offset *= 3;
        QRect r = rect().adjusted(-offset, -offset, offset, offset);
        if (d->dragInProgress && !r.contains(e->position().toPoint()) && d->validIndex(d->pressedIndex)) {
            draggingDock = dockAt(d->pressedIndex);
            if (draggingDock) {
                // We should drag this QDockWidget away by unpluging it.
                // First cancel the QTabBar's internal move
                d->moveTabFinished(d->pressedIndex);
                d->pressedIndex = -1;
                if (d->movingTab)
                    d->movingTab->setVisible(false);
                d->dragStartPosition = QPoint();

                // Then starts the drag using QDockWidgetPrivate's API
                QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
                QDockWidgetLayout *dwlayout = static_cast<QDockWidgetLayout *>(draggingDock->layout());
                dockPriv->initDrag(dwlayout->titleArea().center(), true);
                dockPriv->startDrag(QDockWidgetPrivate::DragScope::Widget);
                if (dockPriv->state)
                    dockPriv->state->ctrlDrag = e->modifiers() & Qt::ControlModifier;
            }
        }
    }

    if (draggingDock) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging) {
            // move will call QMainWindowLayout::hover
            moveToUnplugPosition(e->globalPosition().toPoint(), draggingDock);
        }
    }
    QTabBar::mouseMoveEvent(e);
}